

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_dr_flac_close(ma_dr_flac *pFlac)

{
  long in_RDI;
  ma_dr_flac_oggbs *oggbs;
  ma_allocation_callbacks *in_stack_ffffffffffffffe8;
  long *in_stack_fffffffffffffff0;
  
  if (in_RDI != 0) {
    if (*(code **)(in_RDI + 0x130) == ma_dr_flac__on_read_stdio) {
      fclose(*(FILE **)(in_RDI + 0x140));
    }
    if ((*(int *)(in_RDI + 0x40) == 1) &&
       (in_stack_fffffffffffffff0 = *(long **)(in_RDI + 0x120),
       (code *)*in_stack_fffffffffffffff0 == ma_dr_flac__on_read_stdio)) {
      fclose((FILE *)in_stack_fffffffffffffff0[2]);
    }
    ma_dr_flac__free_from_callbacks(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

MA_API void ma_dr_flac_close(ma_dr_flac* pFlac)
{
    if (pFlac == NULL) {
        return;
    }
#ifndef MA_DR_FLAC_NO_STDIO
    if (pFlac->bs.onRead == ma_dr_flac__on_read_stdio) {
        fclose((FILE*)pFlac->bs.pUserData);
    }
#ifndef MA_DR_FLAC_NO_OGG
    if (pFlac->container == ma_dr_flac_container_ogg) {
        ma_dr_flac_oggbs* oggbs = (ma_dr_flac_oggbs*)pFlac->_oggbs;
        MA_DR_FLAC_ASSERT(pFlac->bs.onRead == ma_dr_flac__on_read_ogg);
        if (oggbs->onRead == ma_dr_flac__on_read_stdio) {
            fclose((FILE*)oggbs->pUserData);
        }
    }
#endif
#endif
    ma_dr_flac__free_from_callbacks(pFlac, &pFlac->allocationCallbacks);
}